

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Gia_Man_t * Acb_NtkToGia2(Acb_Ntk_t *p,int fUseBuf,int fUseXors,Vec_Int_t *vTargets,int nTargets)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  int *piVar7;
  int iVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  size_t sVar10;
  char *__dest;
  int *piVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *vTemp;
  Vec_Int_t *__ptr;
  Gia_Man_t *pGVar13;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar9 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  if (pcVar9 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar9);
    __dest = (char *)malloc(sVar10 + 1);
    strcpy(__dest,pcVar9);
  }
  p_00->pName = __dest;
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar1) {
    piVar11 = (p->vObjCopy).pArray;
    if (piVar11 == (int *)0x0) {
      piVar11 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar11 = (int *)realloc(piVar11,(long)(int)uVar1 << 2);
    }
    (p->vObjCopy).pArray = piVar11;
    if (piVar11 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vObjCopy).nSize = uVar1;
  if (0 < (p->vCis).nSize) {
    lVar15 = 0;
    do {
      uVar1 = (p->vCis).pArray[lVar15];
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_003b477c;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_003b477c;
      if ((int)uVar1 < 1) goto LAB_003b47c3;
      iVar2 = (p->vObjCopy).nSize;
      if (iVar2 < 1) goto LAB_003b47ba;
      if (iVar2 <= (int)uVar1) goto LAB_003b479b;
      piVar11 = (p->vObjCopy).pArray;
      if (piVar11[uVar1] != -1) goto LAB_003b47e2;
      piVar11[uVar1] = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCis).nSize);
  }
  if (vTargets == (Vec_Int_t *)0x0) {
    if (0 < nTargets) {
      do {
        pGVar12 = Gia_ManAppendObj(p_00);
        uVar5 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar5 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar5 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar6 = p_00->pObjs;
        if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_003b477c;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
        if ((pGVar12 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar12)) goto LAB_003b477c;
        nTargets = nTargets + -1;
      } while (nTargets != 0);
    }
  }
  else if (0 < vTargets->nSize) {
    lVar15 = 0;
    do {
      uVar1 = vTargets->pArray[lVar15];
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) {
LAB_003b477c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_003b477c;
      if ((int)uVar1 < 1) goto LAB_003b47c3;
      iVar2 = (p->vObjCopy).nSize;
      if (iVar2 < 1) goto LAB_003b47ba;
      if (iVar2 <= (int)uVar1) goto LAB_003b479b;
      piVar11 = (p->vObjCopy).pArray;
      if (piVar11[uVar1] != -1) goto LAB_003b47e2;
      piVar11[uVar1] = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
    } while (lVar15 < vTargets->nSize);
  }
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 0x10;
  vTemp->nSize = 0;
  piVar11 = (int *)malloc(0x40);
  vTemp->pArray = piVar11;
  __ptr = Acb_NtkFindNodes2(p);
  iVar2 = __ptr->nSize;
  if (0 < (long)iVar2) {
    piVar11 = __ptr->pArray;
    lVar15 = 0;
    do {
      iVar3 = piVar11[lVar15];
      lVar14 = (long)iVar3;
      if (lVar14 < 1) goto LAB_003b47c3;
      iVar4 = (p->vObjCopy).nSize;
      if (iVar4 < 1) goto LAB_003b47ba;
      if (iVar4 <= iVar3) goto LAB_003b479b;
      if ((p->vObjCopy).pArray[lVar14] == -1) {
        iVar8 = Acb_ObjToGia2(p_00,fUseBuf,p,iVar3,vTemp,fUseXors);
        iVar4 = (p->vObjCopy).nSize;
        if (iVar4 < 1) goto LAB_003b47ba;
        if (iVar4 <= iVar3) goto LAB_003b479b;
        piVar7 = (p->vObjCopy).pArray;
        if (piVar7[lVar14] != -1) {
LAB_003b47e2:
          __assert_fail("Acb_ObjCopy(p, i) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0x11a,"void Acb_ObjSetCopy(Acb_Ntk_t *, int, int)");
        }
        piVar7[lVar14] = iVar8;
      }
      lVar15 = lVar15 + 1;
    } while (iVar2 != lVar15);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (int *)0x0;
  }
  free(vTemp);
  if (0 < (p->vCos).nSize) {
    lVar15 = 0;
    do {
      iVar2 = (p->vCos).pArray[lVar15];
      if ((long)iVar2 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar2) {
LAB_003b479b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vObjFans).pArray[iVar2];
      if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = (p->vFanSto).pArray[(long)iVar2 + 1];
      if ((long)iVar2 < 1) goto LAB_003b47c3;
      iVar3 = (p->vObjCopy).nSize;
      if (iVar3 < 1) goto LAB_003b47ba;
      if (iVar3 <= iVar2) goto LAB_003b479b;
      Gia_ManAppendCo(p_00,(p->vObjCopy).pArray[iVar2]);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (p->vCos).nSize);
  }
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManUpdateCopy(&p->vObjCopy,p_00);
  Gia_ManStop(p_00);
  return pGVar13;
LAB_003b47c3:
  pcVar9 = "i>0";
  goto LAB_003b47ca;
LAB_003b47ba:
  pcVar9 = "Acb_NtkHasObjCopies(p)";
LAB_003b47ca:
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x108,"int Acb_ObjCopy(Acb_Ntk_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkToGia2( Acb_Ntk_t * p, int fUseBuf, int fUseXors, Vec_Int_t * vTargets, int nTargets )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    if ( vTargets )
        Vec_IntForEachEntry( vTargets, iObj, i )
            Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    else
        for ( i = 0; i < nTargets; i++ )
            Gia_ManAppendCi(pNew);
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
        if ( Acb_ObjCopy(p, iObj) == -1 ) // skip targets assigned above
            Acb_ObjSetCopy( p, iObj, Acb_ObjToGia2(pNew, fUseBuf, p, iObj, vFanins, fUseXors) );
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, Acb_ObjFanin(p, iObj, 0)) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManUpdateCopy( &p->vObjCopy, pOne );
    Gia_ManStop( pOne );
    return pNew;
}